

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execMove0<(moira::Instr)71,(moira::Mode)1,(moira::Size)4>(Moira *this,u16 opcode)

{
  int iVar1;
  u32 uVar2;
  
  iVar1 = *(int *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  (this->reg).sr.n = SUB41((uint)iVar1 >> 0x1f,0);
  (this->reg).sr.z = iVar1 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  *(int *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58) = iVar1;
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  return;
}

Assistant:

void
Moira::execMove0(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M, S, STD_AE_FRAME> (src, ea, data)) return;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    if (!writeOp <MODE_DN, S> (dst, data)) return;

    prefetch<POLLIPL>();
}